

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  basic_fp<unsigned___int128> value_00;
  buffer<char> *buf_00;
  uint64_t divisor;
  result rVar5;
  decimal_fp<float> dVar6;
  format_error *this;
  byte bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint64_t error;
  char cVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  undefined4 uVar20;
  float fVar21;
  undefined4 uVar22;
  decimal_fp<double> dVar23;
  int exp;
  gen_digits_handler handler;
  int local_c4;
  gen_digits_handler local_c0;
  ulong local_a8;
  double local_a0;
  int local_94;
  buffer<char> *local_90;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xc1e,"value is negative");
  }
  uVar15 = (ulong)(uint)precision;
  uVar16 = (ulong)specs & 0xff00000000;
  bVar19 = uVar16 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar16 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      return 0;
    }
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf,uVar15);
    }
    uVar16 = buf->capacity_;
    if (uVar15 <= buf->capacity_) {
      uVar16 = uVar15;
    }
    buf->size_ = uVar16;
    if (-1 < precision) {
      memset(buf->ptr_,0x30,uVar15);
      return -precision;
    }
    goto LAB_0011a19a;
  }
  local_60 = (ulong)specs >> 0x20;
  local_c4 = 0;
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar23 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar23.significand);
      return dVar23.exponent;
    }
    dVar6 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar6.significand);
    return dVar6.exponent;
  }
  local_78 = (ulong)value & 0xfffffffffffff;
  iVar8 = (uint)((ulong)value >> 0x34) - 0x433;
  local_70 = (ulong)value & 0x7ff0000000000000;
  uVar17 = local_78 + 0x10000000000000;
  if (local_70 == 0) {
    uVar17 = local_78;
  }
  local_94 = iVar8;
  if (local_70 == 0) {
    lVar10 = 0x3f;
    if (local_78 != 0) {
      for (; local_78 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar17 = uVar17 << (~(byte)lVar10 + 0x35 & 0x3f);
    iVar8 = -0x427 - ((uint)lVar10 ^ 0x3f);
    local_94 = -0x432;
  }
  iVar4 = (int)((ulong)((long)(-0x32 - iVar8) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar9 = iVar4 + 0x15b;
  uVar11 = iVar4 + 0x162;
  if (-1 < (int)uVar9) {
    uVar11 = uVar9;
  }
  local_68 = (ulong)(uVar11 & 0xfffffff8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar17 << 0xb;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = basic_data<void>::pow10_significands[(long)((int)uVar11 >> 3) + 1];
  uVar17 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  bVar7 = -((char)basic_data<void>::pow10_exponents[(long)((int)uVar11 >> 3) + 1] + (char)iVar8) -
          0x35;
  local_c0.buf = buf->ptr_;
  local_c0.size = 0;
  local_c0.exp10 = 0x154 - (uVar11 & 0xfffffff8);
  local_88 = 1L << (bVar7 & 0x3f);
  uVar18 = uVar17 >> (bVar7 & 0x3f);
  local_c0.precision = precision;
  local_c0.fixed = bVar19;
  if ((uint)uVar18 == 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa40,"");
  }
  if (uVar18 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa41,"");
  }
  uVar9 = (uint)uVar18 | 1;
  uVar11 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  local_c4 = (int)(uVar18 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar11 * 8) >>
                  0x20);
  local_a8 = uVar15;
  local_a0 = value;
  local_90 = buf;
  local_80 = uVar16;
  if (uVar16 == 0x200000000) {
    uVar9 = local_c0.exp10 + local_c4;
    if ((int)(uVar9 ^ 0x7fffffff) < precision && 0 < (int)uVar9) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_c0.precision = uVar9 + precision;
    if (local_c0.precision != 0 && SCARRY4(uVar9,precision) == local_c0.precision < 0)
    goto LAB_00119cce;
    iVar8 = 1;
    if (local_c0.precision >= 0) {
      uVar15 = basic_data<void>::power_of_10_64
               [(long)(uVar18 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar11 * 8)
                      + -0x100000000) >> 0x20] << (bVar7 & 0x3f);
      uVar16 = uVar17 / 10;
      if (uVar15 <= uVar16) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0x9ed,"");
      }
      if (uVar15 < 0xb) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0x9ee,"");
      }
      if (0xfffffffffffffff4 < uVar15 - 0x15) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0x9ef,"");
      }
      if ((uVar15 - uVar16 < uVar16) || (uVar15 + uVar16 * -2 < 0x14)) {
        if ((99 < uVar17) && (uVar15 - (uVar16 - 10) <= uVar16 - 10)) {
          cVar12 = '1';
          goto LAB_0011a144;
        }
        cVar12 = '0';
        bVar19 = true;
      }
      else {
        cVar12 = '0';
LAB_0011a144:
        bVar19 = false;
      }
      iVar8 = 2;
      if (!bVar19) {
        local_c0.size = 1;
        *local_c0.buf = cVar12;
        iVar8 = 1;
      }
    }
  }
  else {
LAB_00119cce:
    uVar16 = local_88 - 1;
    uVar17 = uVar17 & uVar16;
    do {
      lVar10 = (long)local_c4;
      switch(local_c4) {
      case 1:
        cVar12 = (char)uVar18;
        uVar18 = 0;
        goto LAB_00119ddd;
      case 2:
        cVar12 = (char)((uVar18 & 0xffffffff) / 10);
        iVar8 = (int)((uVar18 & 0xffffffff) / 10) * 10;
        break;
      case 3:
        cVar12 = (char)((uVar18 & 0xffffffff) / 100);
        iVar8 = (int)((uVar18 & 0xffffffff) / 100) * 100;
        break;
      case 4:
        cVar12 = (char)((uVar18 & 0xffffffff) / 1000);
        iVar8 = (int)((uVar18 & 0xffffffff) / 1000) * 1000;
        break;
      case 5:
        cVar12 = (char)((uVar18 & 0xffffffff) / 10000);
        iVar8 = (int)((uVar18 & 0xffffffff) / 10000) * 10000;
        break;
      case 6:
        uVar13 = uVar18 >> 5 & 0x7ffffff;
        cVar12 = (char)(uVar13 / 0xc35);
        iVar8 = (int)(uVar13 / 0xc35) * 100000;
        break;
      case 7:
        cVar12 = (char)((uVar18 & 0xffffffff) / 1000000);
        iVar8 = (int)((uVar18 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 8:
        cVar12 = (char)((uVar18 & 0xffffffff) / 10000000);
        iVar8 = (int)((uVar18 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 9:
        cVar12 = (char)((uVar18 & 0xffffffff) / 100000000);
        iVar8 = (int)((uVar18 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 10:
        uVar13 = (uVar18 >> 9 & 0x7fffff) * 0x44b83;
        cVar12 = (char)(uVar13 >> 0x27);
        iVar8 = (uint)(uVar13 >> 0x27) * 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0xa7e,"invalid number of digits");
      }
      uVar18 = (ulong)(uint)((int)uVar18 - iVar8);
LAB_00119ddd:
      local_c4 = local_c4 + -1;
      rVar5 = gen_digits_handler::on_digit
                        (&local_c0,cVar12 + '0',
                         *(long *)(basic_data<void>::pow10_exponents + lVar10 * 4 + 0x54) <<
                         (bVar7 & 0x3f),(uVar18 << (bVar7 & 0x3f)) + uVar17,1,true);
      divisor = local_88;
      if (rVar5 != more) {
        uVar15 = (ulong)rVar5;
      }
      iVar8 = (int)uVar15;
      if (rVar5 != more) goto LAB_00119e85;
    } while (0 < local_c4);
    error = 1;
    do {
      uVar18 = uVar17 * 10;
      error = error * 10;
      uVar17 = uVar18 & uVar16;
      local_c4 = local_c4 + -1;
      rVar5 = gen_digits_handler::on_digit
                        (&local_c0,(char)(uVar18 >> (bVar7 & 0x3f)) + '0',divisor,uVar17,error,false
                        );
      if (rVar5 != more) {
        uVar15 = (ulong)rVar5;
      }
      iVar8 = (int)uVar15;
    } while (rVar5 == more);
  }
LAB_00119e85:
  buf_00 = local_90;
  uVar20 = SUB84(local_a0,0);
  uVar22 = (undefined4)((ulong)local_a0 >> 0x20);
  if (iVar8 == 2) {
    local_a8 = (ulong)(uint)local_c0.precision;
    local_c4 = local_c4 + (local_c0.size - ((int)local_68 + 8)) + 0x15b;
  }
  else {
    local_c4 = local_c4 + local_c0.exp10;
    uVar16 = (ulong)local_c0.size;
    if ((long)uVar16 < 0) {
LAB_0011a19a:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                  ,0x199,"negative value");
    }
    if (local_90->capacity_ < uVar16) {
      (**local_90->_vptr_buffer)(local_90,uVar16);
      uVar20 = SUB84(local_a0,0);
      uVar22 = (undefined4)((ulong)local_a0 >> 0x20);
    }
    if (buf_00->capacity_ < uVar16) {
      uVar16 = buf_00->capacity_;
    }
    buf_00->size_ = uVar16;
  }
  uVar11 = (uint)local_60;
  if (iVar8 == 2) {
    if ((uVar11 >> 0x12 & 1) == 0) {
      local_58 = local_78 | 0x10000000000000;
      if (local_70 == 0) {
        local_58 = local_78;
      }
      bVar19 = local_70 >> 0x35 != 0 && local_78 == 0;
      local_48 = local_94;
    }
    else {
      fVar21 = (float)(double)CONCAT44(uVar22,uVar20);
      uVar9 = (uint)fVar21 & 0x7fffff;
      uVar14 = (uint)fVar21 & 0x7f800000;
      local_58 = (ulong)uVar9 + 0x800000;
      if (uVar14 == 0) {
        local_58 = (ulong)uVar9;
      }
      local_48 = -0x95;
      if (uVar14 != 0) {
        local_48 = ((uint)fVar21 >> 0x17) - 0x96;
      }
      bVar19 = 0xffffff < uVar14 && uVar9 == 0;
    }
    uVar9 = bVar19 + 4;
    if (local_80 != 0x200000000) {
      uVar9 = (uint)bVar19;
    }
    iVar8 = 0x2ff;
    if ((int)local_a8 < 0x2ff) {
      iVar8 = (int)local_a8;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = local_58;
    value_00._24_8_ = uStack_40;
    format_dragon(value_00,uVar9,iVar8,buf_00,&local_c4);
  }
  if ((uVar11 >> 0x13 & 1) == 0 && local_80 != 0x200000000) {
    uVar16 = buf_00->size_;
    if (uVar16 != 0) {
      do {
        iVar8 = local_c4 + 1;
        if (buf_00->ptr_[uVar16 - 1] != '0') goto LAB_0011a072;
        uVar16 = uVar16 - 1;
        local_c4 = iVar8;
      } while (uVar16 != 0);
      uVar16 = 0;
    }
LAB_0011a072:
    if (buf_00->capacity_ < uVar16) {
      (**buf_00->_vptr_buffer)(buf_00,uVar16);
    }
    if (buf_00->capacity_ < uVar16) {
      uVar16 = buf_00->capacity_;
    }
    buf_00->size_ = uVar16;
  }
  return local_c4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}